

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeToFieldMask
          (FieldMaskTree *this,string *prefix,Node *node,FieldMask *out)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  _Rb_tree_node_base *p_Var4;
  size_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string current_path;
  
  current_path.field_2._8_8_ = node;
  if (prefix[1]._M_string_length == 0) {
    if (*(long *)&(this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
      FieldMask::add_paths((FieldMask *)node,(string *)this);
      return;
    }
  }
  else {
    for (p_Var4 = *(_Rb_tree_node_base **)((long)&prefix->field_2 + 8);
        p_Var4 != (_Rb_tree_node_base *)&prefix->_M_string_length;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      lVar1 = *(long *)&(this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header;
      if (lVar1 == 0) {
        __str.field_2._8_8_ = &current_path._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&__str.field_2 + 8),*(long *)(p_Var4 + 1),
                   (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      }
      else {
        local_78 = &__str._M_string_length;
        lVar2 = *(long *)&(this->root_).children._M_t._M_impl;
        std::__cxx11::string::_M_construct<char*>((string *)&local_78,lVar2,lVar2 + lVar1);
        std::__cxx11::string::append((char *)&local_78);
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_78,*(ulong *)(p_Var4 + 1));
        __str.field_2._8_8_ = &current_path._M_string_length;
        out = (FieldMask *)(plVar3 + 2);
        if ((FieldMask *)*plVar3 == out) {
          current_path._M_string_length =
               (size_type)(out->super_Message).super_MessageLite._vptr_MessageLite;
          current_path.field_2._M_allocated_capacity = plVar3[3];
        }
        else {
          current_path._M_string_length =
               (size_type)(out->super_Message).super_MessageLite._vptr_MessageLite;
          __str.field_2._8_8_ = (FieldMask *)*plVar3;
        }
        current_path._M_dataplus._M_p = (pointer)plVar3[1];
        *plVar3 = (long)out;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
      }
      if ((lVar1 != 0) && (local_78 != &__str._M_string_length)) {
        operator_delete(local_78);
      }
      MergeToFieldMask((FieldMaskTree *)((long)&__str.field_2 + 8),*(string **)(p_Var4 + 2),
                       (Node *)current_path.field_2._8_8_,out);
      if ((size_type *)__str.field_2._8_8_ != &current_path._M_string_length) {
        operator_delete((void *)__str.field_2._8_8_);
      }
    }
  }
  return;
}

Assistant:

void FieldMaskTree::MergeToFieldMask(const std::string& prefix,
                                     const Node* node, FieldMask* out) {
  if (node->children.empty()) {
    if (prefix.empty()) {
      // This is the root node.
      return;
    }
    out->add_paths(prefix);
    return;
  }
  for (std::map<std::string, Node*>::const_iterator it = node->children.begin();
       it != node->children.end(); ++it) {
    std::string current_path =
        prefix.empty() ? it->first : prefix + "." + it->first;
    MergeToFieldMask(current_path, it->second, out);
  }
}